

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,int>,double>>,8u>::
small_vector_base<8u>(void)

{
  size_ty sVar1;
  cptr this;
  cptr in_stack_ffffffffffffff98;
  cptr in_stack_ffffffffffffffa0;
  pair<std::pair<int,_int>,_double> *in_stack_ffffffffffffffa8;
  allocator_interface<std::allocator<std::pair<std::pair<int,_int>,_double>_>_>
  *in_stack_ffffffffffffffb0;
  
  allocator_interface<std::allocator<std::pair<std::pair<int,_int>,_double>_>_>::allocator_interface
            (in_stack_ffffffffffffffb0,
             (allocator_interface<std::allocator<std::pair<std::pair<int,_int>,_double>_>_> *)
             in_stack_ffffffffffffffa8);
  sVar1 = small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::get_size
                    ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                      *)0x1ba79c);
  if (sVar1 < 9) {
    small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
    set_to_inline_storage
              ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffff98 =
         small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::begin_ptr
                   ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                     *)0x1ba8d9);
    in_stack_ffffffffffffffa0 =
         small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::end_ptr
                   ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                     *)in_stack_ffffffffffffffa0);
    small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::data_ptr
              ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               0x1ba8f6);
    allocator_interface<std::allocator<std::pair<std::pair<int,_int>,_double>_>_>::
    uninitialized_copy<const_std::pair<std::pair<int,_int>,_double>_*,_false>
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
  }
  else {
    small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::get_size
              ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               0x1ba7b7);
    small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
    allocation_end_ptr((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        *)in_stack_ffffffffffffffa0);
    small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::
    unchecked_allocate((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                        *)in_stack_ffffffffffffffa0,(size_ty)in_stack_ffffffffffffff98,
                       (cptr)0x1ba7d8);
    small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::set_data_ptr
              ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::get_size
              ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               0x1ba7f8);
    small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::set_capacity
              ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               in_stack_ffffffffffffffa0,(size_ty)in_stack_ffffffffffffff98);
    this = small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::begin_ptr
                     ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>
                       *)0x1ba80f);
    small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::end_ptr
              ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               in_stack_ffffffffffffffa0);
    small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::data_ptr
              ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
               0x1ba82d);
    allocator_interface<std::allocator<std::pair<std::pair<int,_int>,_double>_>_>::
    uninitialized_copy<const_std::pair<std::pair<int,_int>,_double>_*,_false>
              ((allocator_interface<std::allocator<std::pair<std::pair<int,_int>,_double>_>_> *)this
               ,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::get_size
            ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
             0x1ba91a);
  small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U>::set_size
            ((small_vector_base<std::allocator<std::pair<std::pair<int,_int>,_double>_>,_8U> *)
             in_stack_ffffffffffffffa0,(size_ty)in_stack_ffffffffffffff98);
  return;
}

Assistant:

GCH_CPP20_CONSTEXPR
      small_vector_base (bypass_tag,
                         const small_vector_base<Allocator, I>& other,
                         const MaybeAlloc&... alloc)
        : alloc_interface (other, alloc...)
      {
        if (InlineCapacity < other.get_size ())
        {
          set_data_ptr (unchecked_allocate (other.get_size (), other.allocation_end_ptr ()));
          set_capacity (other.get_size ());

          GCH_TRY
          {
            uninitialized_copy (other.begin_ptr (), other.end_ptr (), data_ptr ());
          }
          GCH_CATCH (...)
          {
            deallocate (data_ptr (), get_capacity ());
            GCH_THROW;
          }
        }